

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRT.cpp
# Opt level: O3

void __thiscall
Outputs::CRT::CRT::set_new_display_type(CRT *this,int cycles_per_line,Type displayType)

{
  ColourSpace colour_space;
  int height_of_display;
  int colour_cycle_numerator;
  int colour_cycle_denominator;
  int vertical_sync_half_lines;
  bool should_alternate;
  
  if (displayType < NTSC60) {
    (this->scan_target_modals_).intended_gamma = 2.8;
    height_of_display = 0x106;
    if (displayType == PAL50) {
      height_of_display = 0x138;
    }
    colour_space = YUV;
    colour_cycle_numerator = 0xad303;
    colour_cycle_denominator = 0x9c4;
    should_alternate = true;
    vertical_sync_half_lines = 5;
  }
  else {
    if (displayType != NTSC60) {
      return;
    }
    (this->scan_target_modals_).intended_gamma = 2.2;
    height_of_display = 0x106;
    colour_space = YIQ;
    colour_cycle_numerator = 0x1c7;
    colour_cycle_denominator = 2;
    should_alternate = false;
    vertical_sync_half_lines = 6;
  }
  set_new_timing(this,cycles_per_line,height_of_display,colour_space,colour_cycle_numerator,
                 colour_cycle_denominator,vertical_sync_half_lines,should_alternate);
  return;
}

Assistant:

void CRT::set_new_display_type(int cycles_per_line, Outputs::Display::Type displayType) {
	switch(displayType) {
		case Outputs::Display::Type::PAL50:
		case Outputs::Display::Type::PAL60:
			scan_target_modals_.intended_gamma = 2.8f;
			set_new_timing(cycles_per_line, (displayType == Outputs::Display::Type::PAL50) ? 312 : 262, Outputs::Display::ColourSpace::YUV, 709379, 2500, 5, true);
					// i.e. 283.7516 colour cycles per line; 2.5 lines = vertical sync.
		break;

		case Outputs::Display::Type::NTSC60:
			scan_target_modals_.intended_gamma = 2.2f;
			set_new_timing(cycles_per_line, 262, Outputs::Display::ColourSpace::YIQ, 455, 2, 6, false);			// i.e. 227.5 colour cycles per line, 3 lines = vertical sync.
		break;
	}
}